

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O3

Abc_Obj_t * Dec_GraphToAig(Abc_Ntk_t *pNtk,Dec_Graph_t *pFForm,Vec_Ptr_t *vFaninAigs)

{
  long lVar1;
  Abc_Obj_t *pAVar2;
  long lVar3;
  
  if (0 < pFForm->nLeaves) {
    lVar1 = 1;
    lVar3 = 0;
    do {
      if (vFaninAigs->nSize <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      *(void **)(&pFForm->pNodes->eEdge0 + lVar1 * 2) = vFaninAigs->pArray[lVar3];
      lVar3 = lVar3 + 1;
      lVar1 = lVar1 + 3;
    } while (lVar3 < pFForm->nLeaves);
  }
  pAVar2 = Dec_GraphToNetwork(pNtk,pFForm);
  return pAVar2;
}

Assistant:

Abc_Obj_t * Dec_GraphToAig( Abc_Ntk_t * pNtk, Dec_Graph_t * pFForm, Vec_Ptr_t * vFaninAigs )
{
    Abc_Obj_t * pFunc;
    Dec_Node_t * pNode;
    int i;
    Dec_GraphForEachLeaf( pFForm, pNode, i )
        pNode->pFunc = Vec_PtrEntry( vFaninAigs, i );
    pFunc = Dec_GraphToNetwork( pNtk, pFForm );
    return pFunc;
}